

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirDEVICE(void)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  aint local_14;
  char *pcStack_10;
  aint ramtop;
  char *id;
  
  deviceDirectivesCount = deviceDirectivesCount + 1;
  if (deviceDirectivesCount == 1) {
    bVar1 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!sourcePosStack.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/directives.cpp"
                    ,0x84e,"void dirDEVICE()");
    }
    pvVar3 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
    globalDeviceSourcePos.filename = pvVar3->filename;
    globalDeviceSourcePos.line = pvVar3->line;
    globalDeviceSourcePos.colBegin = pvVar3->colBegin;
    globalDeviceSourcePos.colEnd = pvVar3->colEnd;
  }
  pcStack_10 = GetID(&lp);
  if (pcStack_10 == (char *)0x0) {
    Error("[DEVICE] Syntax error in <deviceid>",lp,SUPPRESS);
    return;
  }
  local_14 = 0;
  bVar1 = anyComma(&lp);
  if (bVar1) {
    iVar2 = ParseExpressionNoSyntaxError(&lp,&local_14);
    if (iVar2 == 0) {
      Error("[DEVICE] Syntax error",bp,PASS3);
      return;
    }
    if ((local_14 < 0x5d00) || (0xffff < local_14)) {
      ErrorInt("[DEVICE] valid range for RAMTOP is $5D00..$FFFF",local_14,PASS3);
      return;
    }
  }
  if (((1 < deviceDirectivesCount) || (Devices == (CDevice *)0x0)) &&
     (bVar1 = SetDevice(pcStack_10,local_14), !bVar1)) {
    Error("[DEVICE] Invalid parameter",pcStack_10,IF_FIRST);
  }
  return;
}

Assistant:

static void dirDEVICE() {
	// refresh source position of first DEVICE directive
	if (1 == ++deviceDirectivesCount) {
		assert(!sourcePosStack.empty());
		globalDeviceSourcePos = sourcePosStack.back();
	}

	char* id = GetID(lp);
	if (id) {
		aint ramtop = 0;
		if (anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, ramtop)) {
				Error("[DEVICE] Syntax error", bp); return;
			}
			if (ramtop < 0x5D00 || 0xFFFF < ramtop) {
			  	ErrorInt("[DEVICE] valid range for RAMTOP is $5D00..$FFFF", ramtop); return;
			}
		}
		// if (1 == deviceDirectivesCount && Device) -> device was already set globally, skip SetDevice
		if (1 < deviceDirectivesCount || !Devices) {
			if (!SetDevice(id, ramtop)) {
				Error("[DEVICE] Invalid parameter", id, IF_FIRST);
			}
		}
	} else {
		Error("[DEVICE] Syntax error in <deviceid>", lp, SUPPRESS);
	}
}